

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error ft_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  GX_Blend pGVar1;
  long lVar2;
  FT_Char FVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  FT_UShort FVar6;
  FT_ULong FVar7;
  FT_ULong FVar8;
  FT_Pointer pvVar9;
  uint *puVar10;
  FT_Char delta_1;
  FT_Short delta;
  FT_Short end;
  FT_Short peak;
  FT_Short start;
  GX_AxisCoords axisCoords;
  FT_ULong *dataOffsetArray;
  GX_ItemVarData varData;
  GX_Blend blend;
  FT_UInt shortDeltaCount;
  FT_UInt k;
  FT_UInt j;
  FT_UInt i;
  FT_ULong region_offset;
  FT_UShort format;
  FT_Memory pFStack_30;
  FT_Error error;
  FT_Memory memory;
  FT_Stream stream;
  GX_ItemVarStore itemStore_local;
  FT_ULong offset_local;
  TT_Face face_local;
  
  memory = (FT_Memory)(face->root).stream;
  pFStack_30 = ((FT_Stream)memory)->memory;
  pGVar1 = face->blend;
  axisCoords = (GX_AxisCoords)0x0;
  stream = (FT_Stream)itemStore;
  itemStore_local = (GX_ItemVarStore)offset;
  offset_local = (FT_ULong)face;
  region_offset._4_4_ = FT_Stream_Seek((FT_Stream)memory,offset);
  if ((region_offset._4_4_ == 0) &&
     (region_offset._2_2_ =
           FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4)),
     region_offset._4_4_ == 0)) {
    if (region_offset._2_2_ == 1) {
      FVar7 = FT_Stream_ReadULong((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
      if (region_offset._4_4_ == 0) {
        FVar4 = FT_Stream_ReadUShort((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
        *(uint *)&stream->base = (uint)FVar4;
        if (region_offset._4_4_ == 0) {
          if (*(int *)&stream->base == 0) {
            region_offset._4_4_ = 8;
          }
          else {
            axisCoords = (GX_AxisCoords)
                         ft_mem_realloc(pFStack_30,8,0,(ulong)*(uint *)&stream->base,(void *)0x0,
                                        (FT_Error *)((long)&region_offset + 4));
            if (region_offset._4_4_ == 0) {
              for (k = 0; k < *(uint *)&stream->base; k = k + 1) {
                FVar8 = FT_Stream_ReadULong((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4)
                                           );
                (&axisCoords->startCoord)[k] = FVar8;
                if (region_offset._4_4_ != 0) goto LAB_0033cde5;
              }
              region_offset._4_4_ =
                   FT_Stream_Seek((FT_Stream)memory,(long)&itemStore_local->dataCount + FVar7);
              if (region_offset._4_4_ == 0) {
                FVar4 = FT_Stream_ReadUShort
                                  ((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
                *(FT_UShort *)&stream->pos = FVar4;
                if (region_offset._4_4_ == 0) {
                  FVar4 = FT_Stream_ReadUShort
                                    ((FT_Stream)memory,(FT_Error *)((long)&region_offset + 4));
                  *(uint *)((long)&stream->pos + 4) = (uint)FVar4;
                  if (region_offset._4_4_ == 0) {
                    if ((uint)(ushort)stream->pos == pGVar1->mmvar->num_axis) {
                      pvVar9 = ft_mem_realloc(pFStack_30,8,0,
                                              (ulong)*(uint *)((long)&stream->pos + 4),(void *)0x0,
                                              (FT_Error *)((long)&region_offset + 4));
                      (stream->descriptor).pointer = pvVar9;
                      if (region_offset._4_4_ == 0) {
                        for (k = 0; k < *(uint *)((long)&stream->pos + 4); k = k + 1) {
                          pvVar9 = ft_mem_realloc(pFStack_30,0x18,0,(ulong)(ushort)stream->pos,
                                                  (void *)0x0,(FT_Error *)((long)&region_offset + 4)
                                                 );
                          *(FT_Pointer *)((long)(stream->descriptor).pointer + (ulong)k * 8) =
                               pvVar9;
                          if (region_offset._4_4_ != 0) goto LAB_0033cde5;
                          lVar2 = *(long *)((long)(stream->descriptor).pointer + (ulong)k * 8);
                          for (shortDeltaCount = 0; shortDeltaCount < (ushort)stream->pos;
                              shortDeltaCount = shortDeltaCount + 1) {
                            FVar4 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            if (((region_offset._4_4_ != 0) ||
                                (FVar5 = FT_Stream_ReadUShort
                                                   ((FT_Stream)memory,
                                                    (FT_Error *)((long)&region_offset + 4)),
                                region_offset._4_4_ != 0)) ||
                               (FVar6 = FT_Stream_ReadUShort
                                                  ((FT_Stream)memory,
                                                   (FT_Error *)((long)&region_offset + 4)),
                               region_offset._4_4_ != 0)) goto LAB_0033cde5;
                            *(long *)(lVar2 + (ulong)shortDeltaCount * 0x18) =
                                 (long)(short)FVar4 << 2;
                            *(long *)(lVar2 + (ulong)shortDeltaCount * 0x18 + 8) =
                                 (long)(short)FVar5 << 2;
                            *(long *)(lVar2 + (ulong)shortDeltaCount * 0x18 + 0x10) =
                                 (long)(short)FVar6 << 2;
                          }
                        }
                        pvVar9 = ft_mem_realloc(pFStack_30,0x18,0,(ulong)*(uint *)&stream->base,
                                                (void *)0x0,(FT_Error *)((long)&region_offset + 4));
                        stream->size = (unsigned_long)pvVar9;
                        if (region_offset._4_4_ == 0) {
                          for (k = 0; k < *(uint *)&stream->base; k = k + 1) {
                            puVar10 = (uint *)(stream->size + (ulong)k * 0x18);
                            region_offset._4_4_ =
                                 FT_Stream_Seek((FT_Stream)memory,
                                                (long)&itemStore_local->dataCount +
                                                (&axisCoords->startCoord)[k]);
                            if (region_offset._4_4_ != 0) break;
                            FVar4 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            *puVar10 = (uint)FVar4;
                            if (region_offset._4_4_ != 0) break;
                            FVar4 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            if (region_offset._4_4_ != 0) break;
                            FVar5 = FT_Stream_ReadUShort
                                              ((FT_Stream)memory,
                                               (FT_Error *)((long)&region_offset + 4));
                            puVar10[1] = (uint)FVar5;
                            if (region_offset._4_4_ != 0) break;
                            if (puVar10[1] < (uint)FVar4) {
                              region_offset._4_4_ = 8;
                              break;
                            }
                            if (*(uint *)((long)&stream->pos + 4) < puVar10[1]) {
                              region_offset._4_4_ = 8;
                              break;
                            }
                            pvVar9 = ft_mem_realloc(pFStack_30,4,0,(ulong)puVar10[1],(void *)0x0,
                                                    (FT_Error *)((long)&region_offset + 4));
                            *(FT_Pointer *)(puVar10 + 2) = pvVar9;
                            if (region_offset._4_4_ != 0) break;
                            for (shortDeltaCount = 0; shortDeltaCount < puVar10[1];
                                shortDeltaCount = shortDeltaCount + 1) {
                              FVar5 = FT_Stream_ReadUShort
                                                ((FT_Stream)memory,
                                                 (FT_Error *)((long)&region_offset + 4));
                              *(uint *)(*(long *)(puVar10 + 2) + (ulong)shortDeltaCount * 4) =
                                   (uint)FVar5;
                              if (region_offset._4_4_ != 0) goto LAB_0033cde5;
                              if (*(uint *)((long)&stream->pos + 4) <=
                                  *(uint *)(*(long *)(puVar10 + 2) + (ulong)shortDeltaCount * 4)) {
                                region_offset._4_4_ = 8;
                                goto LAB_0033cde5;
                              }
                            }
                            pvVar9 = ft_mem_realloc(pFStack_30,2,0,(ulong)(puVar10[1] * *puVar10),
                                                    (void *)0x0,
                                                    (FT_Error *)((long)&region_offset + 4));
                            *(FT_Pointer *)(puVar10 + 4) = pvVar9;
                            if (region_offset._4_4_ != 0) break;
                            shortDeltaCount = 0;
                            while (shortDeltaCount < *puVar10 * puVar10[1]) {
                              for (blend._4_4_ = 0; blend._4_4_ < FVar4;
                                  blend._4_4_ = blend._4_4_ + 1) {
                                FVar5 = FT_Stream_ReadUShort
                                                  ((FT_Stream)memory,
                                                   (FT_Error *)((long)&region_offset + 4));
                                if (region_offset._4_4_ != 0) goto LAB_0033cde5;
                                *(FT_UShort *)(*(long *)(puVar10 + 4) + (ulong)shortDeltaCount * 2)
                                     = FVar5;
                                shortDeltaCount = shortDeltaCount + 1;
                              }
                              for (; blend._4_4_ < puVar10[1]; blend._4_4_ = blend._4_4_ + 1) {
                                FVar3 = FT_Stream_ReadChar((FT_Stream)memory,
                                                           (FT_Error *)((long)&region_offset + 4));
                                if (region_offset._4_4_ != 0) goto LAB_0033cde5;
                                *(short *)(*(long *)(puVar10 + 4) + (ulong)shortDeltaCount * 2) =
                                     (short)FVar3;
                                shortDeltaCount = shortDeltaCount + 1;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      region_offset._4_4_ = 8;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      region_offset._4_4_ = 8;
    }
  }
LAB_0033cde5:
  ft_mem_free(pFStack_30,axisCoords);
  return region_offset._4_4_;
}

Assistant:

static FT_Error
  ft_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;
    FT_UInt    i, j, k;
    FT_UInt    shortDeltaCount;

    GX_Blend        blend = face->blend;
    GX_ItemVarData  varData;

    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset )         ||
         FT_READ_USHORT( itemStore->dataCount ) )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !itemStore->dataCount )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_NEW_ARRAY( dataOffsetArray, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( itemStore->axisCount )   ||
         FT_READ_USHORT( itemStore->regionCount ) )
      goto Exit;

    if ( itemStore->axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store:"
                  " number of axes in item variation store\n"
                  "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, itemStore->regionCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList,
                         itemStore->axisCount ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      varData = &itemStore->varData[i];

      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( varData->itemCount )      ||
           FT_READ_USHORT( shortDeltaCount )         ||
           FT_READ_USHORT( varData->regionIdxCount ) )
        goto Exit;

      /* check some data consistency */
      if ( shortDeltaCount > varData->regionIdxCount )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    shortDeltaCount,
                    varData->regionIdxCount ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( varData->regionIdxCount > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    varData->regionIdxCount,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices,
                         varData->regionIdxCount ) )
        goto Exit;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                */
      /*                                                                 */
      /* On input, deltas are (shortDeltaCount + regionIdxCount) bytes   */
      /* each; on output, deltas are expanded to `regionIdxCount' shorts */
      /* each.                                                           */
      if ( FT_NEW_ARRAY( varData->deltaSet,
                         varData->regionIdxCount * varData->itemCount ) )
        goto Exit;

      /* the delta set is stored as a 2-dimensional array of shorts; */
      /* sign-extend signed bytes to signed shorts                   */
      for ( j = 0; j < varData->itemCount * varData->regionIdxCount; )
      {
        for ( k = 0; k < shortDeltaCount; k++, j++ )
        {
          /* read the short deltas */
          FT_Short  delta;


          if ( FT_READ_SHORT( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }

        for ( ; k < varData->regionIdxCount; k++, j++ )
        {
          /* read the (signed) byte deltas */
          FT_Char  delta;


          if ( FT_READ_CHAR( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }